

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# occurrencetocsv.cpp
# Opt level: O2

void no_occ_doit(bool skipheader)

{
  size_t sVar1;
  undefined7 in_register_00000039;
  occurrence q;
  
  if ((int)CONCAT71(in_register_00000039,skipheader) == 0) {
    puts("event_id,period_no,occ_date_id");
  }
  sVar1 = fread(&q,0xc,1,_stdin);
  while ((int)sVar1 != 0) {
    printf("%d, %d, %d\n",(ulong)(uint)q.event_id,(ulong)(uint)q.period_no,
           (ulong)(uint)q.occ_date_id);
    sVar1 = fread(&q,0xc,1,_stdin);
  }
  return;
}

Assistant:

void no_occ_doit(bool skipheader)
{
	if (skipheader == false) printf("event_id,period_no,occ_date_id\n");
	occurrence q;
	int i = fread(&q, sizeof(q), 1, stdin);
	while (i != 0) {
		printf("%d, %d, %d\n", q.event_id, q.period_no, q.occ_date_id);
		i = fread(&q, sizeof(q), 1, stdin);
	}
}